

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O0

void __thiscall
r_exec::PrimaryMDLController::abduce_simulated_imdl
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  Goal *this_00;
  Goal *this_01;
  Code *actor;
  uint64_t after;
  Fact *this_02;
  _GMonitor *m;
  Sim *s;
  Fact *f_sub_goal;
  uint64_t now;
  Goal *sub_goal;
  Sim *sim_local;
  double confidence_local;
  bool opposite_local;
  Fact *f_imdl_local;
  Fact *super_goal_local;
  HLPBindingMap *bm_local;
  PrimaryMDLController *this_local;
  
  _Fact::set_cfd(&f_imdl->super__Fact,confidence);
  this_00 = (Goal *)operator_new(0x160);
  this_01 = _Fact::get_goal(&super_goal->super__Fact);
  actor = Goal::get_actor(this_01);
  Goal::Goal(this_00,&f_imdl->super__Fact,actor,1.0);
  s = sim;
  core::P<r_exec::Sim>::operator=(&this_00->sim,sim);
  after = (*Now)();
  this_02 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact(this_02,(Code *)this_00,after,after,1.0,1.0);
  m = (_GMonitor *)operator_new(0xb8);
  SRMonitor::SRMonitor((SRMonitor *)m,this,&bm->super_BindingMap,sim->thz,this_02,f_imdl);
  PMDLController::add_r_monitor(&this->super_PMDLController,m);
  PMDLController::inject_simulation(&this->super_PMDLController,this_02);
  return;
}

Assistant:

void PrimaryMDLController::abduce_simulated_imdl(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    f_imdl->set_cfd(confidence);
    Goal *sub_goal = new Goal(f_imdl, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    uint64_t now = Now();
    Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
    add_r_monitor(new SRMonitor(this, bm, sim->thz, f_sub_goal, f_imdl));
    inject_simulation(f_sub_goal);
}